

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_exception_inst_addr_mis(DisasContext_conflict12 *ctx)

{
  DisasContext_conflict12 *ctx_local;
  
  generate_exception_mbadaddr(ctx,0);
  return;
}

Assistant:

static void gen_exception_inst_addr_mis(DisasContext *ctx)
{
    generate_exception_mbadaddr(ctx, RISCV_EXCP_INST_ADDR_MIS);
}